

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Abc_NtkPrintFanoutProfile(Abc_Obj_t *pObj)

{
  Abc_Obj_t *p;
  int iVar1;
  char *__s;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  printf("Obj %6d fanouts (%d):\n",(ulong)(uint)pObj->Id,(ulong)(uint)(pObj->vFanouts).nSize);
  for (uVar2 = 0; (long)uVar2 < (long)(pObj->vFanouts).nSize; uVar2 = uVar2 + 1) {
    p = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar2]];
    fVar3 = Bus_SclObjETime(p);
    fVar4 = Bus_SclObjCin(p);
    printf("%3d : time = %7.2f ps   load = %7.2f ff  ",(double)fVar3,(double)fVar4,
           uVar2 & 0xffffffff);
    iVar1 = Abc_NodeFindFanin(p,pObj);
    iVar1 = Abc_ObjFaninPhase(p,iVar1);
    __s = "*";
    if (iVar1 == 0) {
      __s = " ";
    }
    puts(__s);
  }
  putchar(10);
  return;
}

Assistant:

void Abc_NtkPrintFanoutProfile( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    printf( "Obj %6d fanouts (%d):\n", Abc_ObjId(pObj), Abc_ObjFanoutNum(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        printf( "%3d : time = %7.2f ps   load = %7.2f ff  ", i, Bus_SclObjETime(pFanout), Bus_SclObjCin(pFanout) );
        printf( "%s\n", Abc_ObjFaninPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) ) ? "*" : " " );
    }
    printf( "\n" );
}